

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (CompilerMSL *this,SPIRType *type,uint32_t id,bool argument)

{
  StorageClass SVar1;
  bool bVar2;
  ExecutionModel EVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  Bitset *pBVar7;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  SPIRType *type_00;
  byte in_R8B;
  bool local_17f;
  bool local_16a;
  bool local_169;
  char *local_110;
  undefined1 local_102;
  bool local_101;
  uint32_t local_100;
  bool is_masked;
  uint32_t uStack_fc;
  bool is_tess_level;
  uint32_t local_f8;
  BuiltIn builtin;
  uint32_t local_f0;
  byte local_ea;
  bool is_builtin;
  uint32_t local_e8;
  bool is_patch_stage_in;
  bool is_stage_in;
  uint32_t local_e0;
  bool ssbo;
  char *pcStack_d8;
  bool readonly;
  char *addr_space;
  Bitset local_c8;
  uint32_t local_84;
  uint32_t local_80;
  SPIRVariable *local_70;
  SPIRVariable *var;
  Bitset flags;
  bool argument_local;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  type_00 = (SPIRType *)CONCAT44(in_register_00000014,id);
  flags.higher._M_h._M_single_bucket._4_4_ = (uint32_t)CONCAT71(in_register_00000009,argument);
  flags.higher._M_h._M_single_bucket._3_1_ = in_R8B & 1;
  Bitset::Bitset((Bitset *)&var);
  local_70 = Compiler::maybe_get<spirv_cross::SPIRVariable>
                       ((Compiler *)type,flags.higher._M_h._M_single_bucket._4_4_);
  if ((local_70 == (SPIRVariable *)0x0) || (*(int *)&(type_00->super_IVariant).field_0xc != 0xf)) {
LAB_004b6edb:
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)&addr_space,
               flags.higher._M_h._M_single_bucket._4_4_);
    pBVar7 = Compiler::get_decoration_bitset((Compiler *)type,addr_space._0_4_);
    Bitset::operator=((Bitset *)&var,pBVar7);
  }
  else {
    local_80 = (type_00->super_IVariant).self.id;
    bVar2 = Compiler::has_decoration((Compiler *)type,(ID)local_80,DecorationBlock);
    if (!bVar2) {
      local_84 = (type_00->super_IVariant).self.id;
      bVar2 = Compiler::has_decoration((Compiler *)type,(ID)local_84,DecorationBufferBlock);
      if (!bVar2) goto LAB_004b6edb;
    }
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&addr_space + 4),
               flags.higher._M_h._M_single_bucket._4_4_);
    Compiler::get_buffer_block_flags(&local_c8,(Compiler *)type,addr_space._4_4_);
    Bitset::operator=((Bitset *)&var,&local_c8);
    Bitset::~Bitset(&local_c8);
  }
  pcStack_d8 = (char *)0x0;
  SVar1 = type_00->storage;
  if (SVar1 == StorageClassUniformConstant) {
LAB_004b7068:
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      local_e8 = (type_00->super_IVariant).self.id;
      is_stage_in = Compiler::has_decoration((Compiler *)type,(ID)local_e8,DecorationBufferBlock);
      if (is_stage_in) {
        bVar2 = Bitset::get((Bitset *)&var,0x18);
        pcStack_d8 = "device";
        if (bVar2) {
          pcStack_d8 = "const device";
        }
      }
      else {
        pcStack_d8 = "constant";
      }
    }
    else if ((flags.higher._M_h._M_single_bucket._3_1_ & 1) == 0) {
      pcStack_d8 = "constant";
    }
    else {
      bVar2 = type_is_msl_framebuffer_fetch((CompilerMSL *)type,type_00);
      if (bVar2) {
        pcStack_d8 = "";
      }
    }
    goto LAB_004b750b;
  }
  if (SVar1 == StorageClassInput) {
    bVar2 = is_tesc_shader((CompilerMSL *)type);
    if ((bVar2) && (local_70 != (SPIRVariable *)0x0)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_70->basevariable);
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type[0x21].vecsize);
      if ((uVar4 == uVar5) &&
         (pcStack_d8 = "threadgroup",
         ((ulong)type[0x1e].array.super_VectorView<unsigned_int>.ptr & 0x100000000) != 0)) {
        pcStack_d8 = "const device";
      }
    }
    bVar2 = is_tese_shader((CompilerMSL *)type);
    if (((bVar2) &&
        (((ulong)type[0x1e].array.super_VectorView<unsigned_int>.ptr & 0x10000000000) != 0)) &&
       (local_70 != (SPIRVariable *)0x0)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_70->basevariable);
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type[0x21].vecsize);
      is_builtin = uVar4 == uVar5;
      local_f0 = (local_70->super_IVariant).self.id;
      local_ea = Compiler::has_decoration((Compiler *)type,(ID)local_f0,DecorationPatch);
      local_f8 = (local_70->super_IVariant).self.id;
      builtin._3_1_ = Compiler::has_decoration((Compiler *)type,(ID)local_f8,DecorationBuiltIn);
      local_100 = (local_70->super_IVariant).self.id;
      uStack_fc = Compiler::get_decoration((Compiler *)type,(ID)local_100,DecorationBuiltIn);
      local_169 = false;
      if ((builtin._3_1_ & 1) != BuiltInPosition >> 0x18) {
        local_16a = uStack_fc == 0xb || uStack_fc == 0xc;
        local_169 = local_16a;
      }
      local_101 = local_169;
      if (((is_builtin & 1U) != 0) || (((local_ea & 1) != 0 && (local_169 == false)))) {
        pcStack_d8 = "const device";
      }
    }
    EVar3 = Compiler::get_execution_model((Compiler *)type);
    if ((EVar3 == ExecutionModelFragment) && (local_70 != (SPIRVariable *)0x0)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_70->basevariable);
      uVar5 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((long)&type[0x21].super_IVariant._vptr_IVariant + 4));
      if (uVar4 == uVar5) {
        pcStack_d8 = "thread";
      }
    }
    goto LAB_004b750b;
  }
  if (SVar1 == StorageClassUniform) goto LAB_004b7068;
  if (SVar1 == StorageClassOutput) {
    if ((type[0x21].array.buffer_capacity & 0x100000000) != 0) {
      if ((local_70 != (SPIRVariable *)0x0) && (type_00->storage == StorageClassOutput)) {
        local_102 = CompilerGLSL::is_stage_output_variable_masked((CompilerGLSL *)type,local_70);
        if ((bool)local_102) {
          bVar2 = Compiler::is_tessellation_shader((Compiler *)type);
          if (bVar2) {
            pcStack_d8 = "threadgroup";
          }
          else {
            pcStack_d8 = "thread";
          }
        }
        else {
          uVar6 = (*(type->super_IVariant)._vptr_IVariant[0x1c])(type,local_70,4);
          if ((uVar6 & 1) != 0) {
            pcStack_d8 = "threadgroup";
          }
        }
      }
      if (pcStack_d8 == (char *)0x0) {
        pcStack_d8 = "device";
      }
    }
    goto LAB_004b750b;
  }
  if (SVar1 == StorageClassWorkgroup) {
    pcStack_d8 = "threadgroup";
    goto LAB_004b750b;
  }
  if (SVar1 - StorageClassFunction < 2) goto LAB_004b750b;
  if (SVar1 == StorageClassPushConstant) goto LAB_004b7068;
  if ((SVar1 != StorageClassStorageBuffer) && (SVar1 != StorageClassPhysicalStorageBuffer))
  goto LAB_004b750b;
  ssbo = false;
  if (local_70 == (SPIRVariable *)0x0) {
LAB_004b701d:
    ssbo = Bitset::get((Bitset *)&var,0x18);
  }
  else {
    local_e0 = (type_00->super_IVariant).self.id;
    bVar2 = Compiler::has_decoration((Compiler *)type,(ID)local_e0,DecorationBlock);
    if (bVar2) goto LAB_004b701d;
  }
  pcStack_d8 = "device";
  if ((ssbo & 1U) != 0) {
    pcStack_d8 = "const device";
  }
LAB_004b750b:
  if (pcStack_d8 == (char *)0x0) {
    bVar2 = true;
    if (((type_00->pointer & 1U) == 0) &&
       (bVar2 = false, (flags.higher._M_h._M_single_bucket._3_1_ & 1) != 0)) {
      bVar2 = *(int *)&(type_00->super_IVariant).field_0xc == 0x15;
    }
    pcStack_d8 = "";
    if (bVar2) {
      pcStack_d8 = "thread";
    }
  }
  bVar2 = Bitset::get((Bitset *)&var,0x15);
  local_17f = true;
  if (!bVar2) {
    local_17f = Bitset::get((Bitset *)&var,0x17);
  }
  local_110 = "";
  if (local_17f != false) {
    local_110 = "volatile ";
  }
  join<char_const*,char_const*&>((spirv_cross *)this,&local_110,&stack0xffffffffffffff28);
  Bitset::~Bitset((Bitset *)&var);
  return this;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	return join(flags.get(DecorationVolatile) || flags.get(DecorationCoherent) ? "volatile " : "", addr_space);
}